

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O1

char * MyGame_Example_Any_parse_json_union
                 (flatcc_json_parser_t *ctx,char *buf,char *end,uint8_t type,
                 flatcc_builder_ref_t *result)

{
  byte bVar1;
  uint8_t uVar2;
  int iVar3;
  flatcc_builder_ref_t fVar4;
  size_t n;
  char *pcVar5;
  ulong uVar6;
  ulong *puVar7;
  uint8_t *puVar8;
  undefined7 in_register_00000009;
  byte *pbVar9;
  flatcc_builder_t *B;
  ulong *puVar10;
  ulong uVar11;
  bool bVar12;
  int8_t val;
  uint64_t value;
  int more;
  uint8_t local_4d;
  int local_4c;
  undefined8 local_48;
  int local_3c;
  ulong local_38;
  
  *result = 0;
  switch(CONCAT71(in_register_00000009,type) & 0xffffffff) {
  case 0:
    if ((3 < (long)end - (long)buf) && (*(int *)buf == 0x6c6c756e)) {
      return buf + 4;
    }
    iVar3 = 0x1a;
    goto LAB_00110c9c;
  case 1:
    buf = MyGame_Example_Monster_parse_json_table(ctx,buf,end,result);
    goto LAB_001117b3;
  case 2:
    *result = 0;
    iVar3 = flatcc_builder_start_table(ctx->ctx,4);
    if (iVar3 == 0) {
      if ((buf == end) || (*buf != '{')) {
        local_3c = 0;
        buf = flatcc_json_parser_set_error(ctx,buf,end,0x15);
      }
      else {
        puVar10 = (ulong *)(buf + 1);
        if ((long)end - (long)puVar10 < 2) {
LAB_00110d63:
          puVar10 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar10,end);
        }
        else if ((char)(byte)*puVar10 < '!') {
          if (((byte)*puVar10 != 0x20) || (buf[2] < '!')) goto LAB_00110d63;
          puVar10 = (ulong *)(buf + 2);
        }
        if ((puVar10 == (ulong *)end) || ((byte)*puVar10 != 0x7d)) {
          local_3c = 1;
          buf = (char *)puVar10;
        }
        else {
          local_3c = 0;
          buf = (char *)((long)puVar10 + 1);
          if ((long)end - (long)buf < 2) {
LAB_0011180a:
            buf = flatcc_json_parser_space_ext(ctx,buf,end);
          }
          else if (*buf < '!') {
            if ((*buf != 0x20) || ((char)*(byte *)((long)puVar10 + 2) < '!')) goto LAB_0011180a;
            buf = (char *)((long)puVar10 + 2);
          }
        }
      }
      if (local_3c != 0) {
        local_38 = 0x636f6c6f72320000;
        do {
          if (buf != end) {
            if ((byte)*(ulong *)buf == 0x2e) {
              buf = flatcc_json_parser_set_error(ctx,buf,end,5);
            }
            else if ((byte)*(ulong *)buf == 0x22) {
              buf = (char *)((long)buf + 1);
              ctx->unquoted = 0;
            }
            else {
              ctx->unquoted = 1;
            }
          }
          uVar6 = (long)end - (long)buf;
          if (uVar6 < 8) {
            uVar11 = 0;
            switch(uVar6) {
            case 7:
              uVar11 = (long)(char)*(byte *)((long)buf + 6) << 8;
            case 6:
              uVar11 = uVar11 | (long)(char)*(byte *)((long)buf + 5) << 0x10;
            case 5:
              uVar11 = uVar11 | (long)(char)*(byte *)((long)buf + 4) << 0x18;
            case 4:
              uVar11 = uVar11 | (long)(char)*(byte *)((long)buf + 3) << 0x20;
            case 3:
              uVar11 = uVar11 | (long)(char)*(byte *)((long)buf + 2) << 0x28;
            case 2:
              uVar11 = uVar11 | (long)(char)*(byte *)((long)buf + 1) << 0x30;
            case 1:
              uVar11 = uVar11 | (ulong)(byte)*(ulong *)buf << 0x38;
            }
          }
          else {
            uVar11 = *(ulong *)buf;
            uVar11 = (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                     (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                     (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
          }
          puVar10 = (ulong *)buf;
          if ((uVar11 & 0xffffffffffff0000) == local_38) {
            if (6 < (long)uVar6) {
              bVar1 = *(byte *)((long)buf + 6);
              if (ctx->unquoted == 0) {
                if (bVar1 == 0x22) {
                  pbVar9 = (byte *)((long)buf + 7);
                  goto LAB_00110f57;
                }
              }
              else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
                pbVar9 = (byte *)((long)buf + 6);
                ctx->unquoted = 0;
LAB_00110f57:
                if ((long)end - (long)pbVar9 < 2) {
LAB_00110f75:
                  pbVar9 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar9,end);
                }
                else if ((char)*pbVar9 < '!') {
                  if ((*pbVar9 != 0x20) || ((char)pbVar9[1] < '!')) goto LAB_00110f75;
                  pbVar9 = pbVar9 + 1;
                }
                if ((pbVar9 == (byte *)end) || (*pbVar9 != 0x3a)) {
                  puVar10 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar9,end,4);
                }
                else {
                  puVar10 = (ulong *)(pbVar9 + 1);
                  if ((long)end - (long)puVar10 < 2) {
LAB_00111072:
                    puVar10 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar10,end);
                  }
                  else if ((char)(byte)*puVar10 < '!') {
                    if (((byte)*puVar10 != 0x20) || ((char)pbVar9[2] < '!')) goto LAB_00111072;
                    puVar10 = (ulong *)(pbVar9 + 2);
                  }
                }
              }
            }
            if ((ulong *)buf == puVar10) goto LAB_00111208;
            local_4d = '\0';
            local_48 = 0;
            local_4c = 0;
            buf = (char *)puVar10;
            if ((puVar10 != (ulong *)end) &&
               (buf = flatcc_json_parser_integer(ctx,(char *)puVar10,end,&local_4c,&local_48),
               (ulong *)buf != puVar10)) {
              if (local_4c == 0) {
                uVar6 = local_48;
                if (local_48 < 0x80) goto LAB_00111111;
                iVar3 = 7;
              }
              else {
                if (local_48 < 0x81) {
                  uVar6 = -local_48;
LAB_00111111:
                  local_4d = (uint8_t)uVar6;
                  goto LAB_00111115;
                }
                iVar3 = 8;
              }
              buf = flatcc_json_parser_set_error(ctx,buf,end,iVar3);
            }
LAB_00111115:
            if ((puVar10 != (ulong *)buf) ||
               (puVar10 = (ulong *)flatcc_json_parser_symbolic_int8
                                             (ctx,buf,end,
                                              (flatcc_json_parser_integral_symbol_f **)
                                              MyGame_Example_TestSimpleTableWithEnum_parse_json_table_symbolic_parsers
                                              ,(int8_t *)&local_4d),
               bVar12 = puVar10 != (ulong *)buf, buf = (char *)puVar10,
               puVar10 != (ulong *)end && bVar12)) {
              if ((local_4d == '\x02') && (bVar12 = true, (ctx->flags & 2) == 0))
              goto joined_r0x00111479;
              B = ctx->ctx;
              iVar3 = 1;
              puVar10 = (ulong *)buf;
LAB_00111684:
              uVar2 = local_4d;
              puVar8 = (uint8_t *)flatcc_builder_table_add(B,iVar3,1,1);
              if (puVar8 != (uint8_t *)0x0) {
                *puVar8 = uVar2;
                bVar12 = true;
                buf = (char *)puVar10;
                goto joined_r0x00111479;
              }
            }
LAB_0011169a:
            bVar12 = false;
            buf = (char *)puVar10;
joined_r0x00111479:
            if (!bVar12) goto LAB_0011179d;
          }
          else {
            if ((uVar11 & 0xffffffffff000000) == 0x636f6c6f72000000) {
              if (5 < (long)uVar6) {
                bVar1 = *(byte *)((long)buf + 5);
                if (ctx->unquoted == 0) {
                  if (bVar1 == 0x22) {
                    pbVar9 = (byte *)((long)buf + 6);
                    goto LAB_00110fec;
                  }
                }
                else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
                  pbVar9 = (byte *)((long)buf + 5);
                  ctx->unquoted = 0;
LAB_00110fec:
                  if ((long)end - (long)pbVar9 < 2) {
LAB_0011100a:
                    pbVar9 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar9,end);
                  }
                  else if ((char)*pbVar9 < '!') {
                    if ((*pbVar9 != 0x20) || ((char)pbVar9[1] < '!')) goto LAB_0011100a;
                    pbVar9 = pbVar9 + 1;
                  }
                  if ((pbVar9 == (byte *)end) || (*pbVar9 != 0x3a)) {
                    puVar10 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar9,end,4);
                  }
                  else {
                    puVar10 = (ulong *)(pbVar9 + 1);
                    if ((long)end - (long)puVar10 < 2) {
LAB_0011117a:
                      puVar10 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar10,end);
                    }
                    else if ((char)(byte)*puVar10 < '!') {
                      if (((byte)*puVar10 != 0x20) || ((char)pbVar9[2] < '!')) goto LAB_0011117a;
                      puVar10 = (ulong *)(pbVar9 + 2);
                    }
                  }
                }
              }
              if ((ulong *)buf == puVar10) goto LAB_00111208;
              local_4d = '\0';
              local_48 = 0;
              local_4c = 0;
              buf = (char *)puVar10;
              if ((puVar10 != (ulong *)end) &&
                 (buf = flatcc_json_parser_integer(ctx,(char *)puVar10,end,&local_4c,&local_48),
                 (ulong *)buf != puVar10)) {
                if (local_4c == 0) {
                  uVar6 = local_48;
                  if (local_48 < 0x80) goto LAB_001113ff;
                  iVar3 = 7;
                }
                else {
                  if (local_48 < 0x81) {
                    uVar6 = -local_48;
LAB_001113ff:
                    local_4d = (uint8_t)uVar6;
                    goto LAB_00111403;
                  }
                  iVar3 = 8;
                }
                buf = flatcc_json_parser_set_error(ctx,buf,end,iVar3);
              }
LAB_00111403:
              if ((puVar10 == (ulong *)buf) &&
                 (puVar10 = (ulong *)flatcc_json_parser_symbolic_int8
                                               (ctx,buf,end,
                                                (flatcc_json_parser_integral_symbol_f **)
                                                MyGame_Example_TestSimpleTableWithEnum_parse_json_table_symbolic_parsers_213
                                                ,(int8_t *)&local_4d),
                 bVar12 = puVar10 == (ulong *)buf, buf = (char *)puVar10,
                 puVar10 == (ulong *)end || bVar12)) {
                bVar12 = false;
              }
              else {
                uVar2 = local_4d;
                if ((local_4d != '\x02') || (bVar12 = true, (ctx->flags & 2) != 0)) {
                  bVar12 = false;
                  puVar8 = (uint8_t *)flatcc_builder_table_add(ctx->ctx,0,1,1);
                  if (puVar8 != (uint8_t *)0x0) {
                    *puVar8 = uVar2;
                    bVar12 = true;
                  }
                }
              }
              goto joined_r0x00111479;
            }
LAB_00111208:
            puVar7 = puVar10;
            if ((uint)(uVar11 >> 0x28) == 0x756332) {
              if (3 < (long)end - (long)puVar10) {
                bVar1 = *(byte *)((long)puVar10 + 3);
                if (ctx->unquoted == 0) {
                  if (bVar1 == 0x22) {
                    pbVar9 = (byte *)((long)puVar10 + 4);
                    goto LAB_001112bd;
                  }
                }
                else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
                  pbVar9 = (byte *)((long)puVar10 + 3);
                  ctx->unquoted = 0;
LAB_001112bd:
                  if ((long)end - (long)pbVar9 < 2) {
LAB_001112db:
                    pbVar9 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar9,end);
                  }
                  else if ((char)*pbVar9 < '!') {
                    if ((*pbVar9 != 0x20) || ((char)pbVar9[1] < '!')) goto LAB_001112db;
                    pbVar9 = pbVar9 + 1;
                  }
                  if ((pbVar9 == (byte *)end) || (*pbVar9 != 0x3a)) {
                    puVar7 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar9,end,4);
                  }
                  else {
                    puVar7 = (ulong *)(pbVar9 + 1);
                    if ((long)end - (long)puVar7 < 2) {
LAB_00111484:
                      puVar7 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar7,end);
                    }
                    else if ((char)(byte)*puVar7 < '!') {
                      if (((byte)*puVar7 != 0x20) || ((char)pbVar9[2] < '!')) goto LAB_00111484;
                      puVar7 = (ulong *)(pbVar9 + 2);
                    }
                  }
                }
              }
              if (puVar10 != puVar7) {
                local_4d = '\0';
                local_48 = 0;
                local_4c = 0;
                buf = (char *)puVar7;
                if ((puVar7 != (ulong *)end) &&
                   (buf = flatcc_json_parser_integer(ctx,(char *)puVar7,end,&local_4c,&local_48),
                   (ulong *)buf != puVar7)) {
                  if (local_4c == 0) {
                    if (local_48 < 0x100) {
                      local_4d = (uint8_t)local_48;
                      goto LAB_00111516;
                    }
                    iVar3 = 7;
                  }
                  else {
                    iVar3 = 8;
                  }
                  buf = flatcc_json_parser_set_error(ctx,buf,end,iVar3);
                }
LAB_00111516:
                if ((puVar7 == (ulong *)buf) &&
                   (puVar10 = (ulong *)flatcc_json_parser_symbolic_uint8
                                                 (ctx,buf,end,
                                                  (flatcc_json_parser_integral_symbol_f **)
                                                  MyGame_Example_TestSimpleTableWithEnum_parse_json_table_symbolic_parsers_214
                                                  ,&local_4d), bVar12 = puVar10 == (ulong *)buf,
                   buf = (char *)puVar10, puVar10 == (ulong *)end || bVar12)) goto LAB_0011169a;
                if ((local_4d != '\x02') || (bVar12 = true, (ctx->flags & 2) != 0)) {
                  B = ctx->ctx;
                  iVar3 = 3;
                  puVar10 = (ulong *)buf;
                  goto LAB_00111684;
                }
                goto joined_r0x00111479;
              }
            }
            else if ((short)(uVar11 >> 0x30) == 0x7563) {
              if (2 < (long)end - (long)puVar10) {
                bVar1 = *(byte *)((long)puVar10 + 2);
                if (ctx->unquoted == 0) {
                  if (bVar1 == 0x22) {
                    pbVar9 = (byte *)((long)puVar10 + 3);
                    goto LAB_00111352;
                  }
                }
                else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
                  pbVar9 = (byte *)((long)puVar10 + 2);
                  ctx->unquoted = 0;
LAB_00111352:
                  if ((long)end - (long)pbVar9 < 2) {
LAB_00111394:
                    pbVar9 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar9,end);
                  }
                  else if ((char)*pbVar9 < '!') {
                    if ((*pbVar9 != 0x20) || ((char)pbVar9[1] < '!')) goto LAB_00111394;
                    pbVar9 = pbVar9 + 1;
                  }
                  if ((pbVar9 == (byte *)end) || (*pbVar9 != 0x3a)) {
                    puVar7 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar9,end,4);
                  }
                  else {
                    puVar7 = (ulong *)(pbVar9 + 1);
                    if ((long)end - (long)puVar7 < 2) {
LAB_00111581:
                      puVar7 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar7,end);
                    }
                    else if ((char)(byte)*puVar7 < '!') {
                      if (((byte)*puVar7 != 0x20) || ((char)pbVar9[2] < '!')) goto LAB_00111581;
                      puVar7 = (ulong *)(pbVar9 + 2);
                    }
                  }
                }
              }
              if (puVar10 != puVar7) {
                local_4d = '\0';
                local_48 = 0;
                local_4c = 0;
                buf = (char *)puVar7;
                if ((puVar7 != (ulong *)end) &&
                   (buf = flatcc_json_parser_integer(ctx,(char *)puVar7,end,&local_4c,&local_48),
                   (ulong *)buf != puVar7)) {
                  if (local_4c == 0) {
                    if (local_48 < 0x100) {
                      local_4d = (uint8_t)local_48;
                      goto LAB_0011162c;
                    }
                    iVar3 = 7;
                  }
                  else {
                    iVar3 = 8;
                  }
                  buf = flatcc_json_parser_set_error(ctx,buf,end,iVar3);
                }
LAB_0011162c:
                if ((puVar7 == (ulong *)buf) &&
                   (puVar10 = (ulong *)flatcc_json_parser_symbolic_uint8
                                                 (ctx,buf,end,
                                                  (flatcc_json_parser_integral_symbol_f **)
                                                  MyGame_Example_TestSimpleTableWithEnum_parse_json_table_symbolic_parsers_215
                                                  ,&local_4d), bVar12 = puVar10 == (ulong *)buf,
                   buf = (char *)puVar10, puVar10 == (ulong *)end || bVar12)) goto LAB_0011169a;
                if ((local_4d != '\x02') || (bVar12 = true, (ctx->flags & 2) != 0)) {
                  B = ctx->ctx;
                  iVar3 = 2;
                  puVar10 = (ulong *)buf;
                  goto LAB_00111684;
                }
                goto joined_r0x00111479;
              }
            }
            buf = flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar7,end);
          }
          buf = flatcc_json_parser_object_end(ctx,buf,end,&local_3c);
        } while (local_3c != 0);
      }
LAB_00111796:
      if (ctx->error == 0) {
        fVar4 = flatcc_builder_end_table(ctx->ctx);
        *result = fVar4;
        if (fVar4 != 0) goto LAB_001117b3;
      }
    }
    break;
  case 3:
    *result = 0;
    iVar3 = flatcc_builder_start_table(ctx->ctx,0);
    if (iVar3 == 0) {
      if ((buf == end) || (*buf != '{')) {
        local_48 = local_48 & 0xffffffff00000000;
        buf = flatcc_json_parser_set_error(ctx,buf,end,0x15);
      }
      else {
        puVar10 = (ulong *)(buf + 1);
        if ((long)end - (long)puVar10 < 2) {
LAB_001116d3:
          puVar10 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar10,end);
        }
        else if ((char)(byte)*puVar10 < '!') {
          if (((byte)*puVar10 != 0x20) || (buf[2] < '!')) goto LAB_001116d3;
          puVar10 = (ulong *)(buf + 2);
        }
        if ((puVar10 == (ulong *)end) || ((byte)*puVar10 != 0x7d)) {
          local_48 = CONCAT44(local_48._4_4_,1);
          buf = (char *)puVar10;
        }
        else {
          local_48 = (ulong)local_48._4_4_ << 0x20;
          buf = (char *)((long)puVar10 + 1);
          if ((long)end - (long)buf < 2) {
LAB_0011182b:
            buf = flatcc_json_parser_space_ext(ctx,buf,end);
          }
          else if (*buf < '!') {
            if ((*buf != 0x20) || ((char)*(byte *)((long)puVar10 + 2) < '!')) goto LAB_0011182b;
            buf = (char *)((long)puVar10 + 2);
          }
        }
      }
      if ((int)local_48 != 0) {
        do {
          if (buf != end) {
            if ((byte)*(ulong *)buf == 0x2e) {
              buf = flatcc_json_parser_set_error(ctx,buf,end,5);
            }
            else if ((byte)*(ulong *)buf == 0x22) {
              buf = (char *)((long)buf + 1);
              ctx->unquoted = 0;
            }
            else {
              ctx->unquoted = 1;
            }
          }
          pcVar5 = flatcc_json_parser_unmatched_symbol(ctx,buf,end);
          buf = flatcc_json_parser_object_end(ctx,pcVar5,end,(int *)&local_48);
        } while ((int)local_48 != 0);
      }
      goto LAB_00111796;
    }
    break;
  case 4:
    buf = MyGame_Example_Alt_parse_json_table(ctx,buf,end,result);
    goto LAB_001117b3;
  default:
    if ((ctx->flags & 1) != 0) {
      pcVar5 = flatcc_json_parser_generic_json(ctx,buf,end);
      return pcVar5;
    }
    iVar3 = 0xf;
LAB_00110c9c:
    pcVar5 = flatcc_json_parser_set_error(ctx,buf,end,iVar3);
    return pcVar5;
  }
LAB_0011179d:
  buf = flatcc_json_parser_set_error(ctx,buf,end,0x23);
LAB_001117b3:
  if ((ctx->error == 0) && (*result == 0)) {
    buf = flatcc_json_parser_set_error(ctx,buf,end,0x23);
  }
  return (char *)(ulong *)buf;
}

Assistant:

static const char *MyGame_Example_Any_parse_json_union(flatcc_json_parser_t *ctx, const char *buf, const char *end, uint8_t type, flatcc_builder_ref_t *result)
{

    *result = 0;
    switch (type) {
    case 0: /* NONE */
        return flatcc_json_parser_none(ctx, buf, end);
    case 1: /* Monster */
        buf = MyGame_Example_Monster_parse_json_table(ctx, buf, end, result);
        break;
    case 2: /* TestSimpleTableWithEnum */
        buf = MyGame_Example_TestSimpleTableWithEnum_parse_json_table(ctx, buf, end, result);
        break;
    case 3: /* Monster2 */
        buf = MyGame_Example2_Monster_parse_json_table(ctx, buf, end, result);
        break;
    case 4: /* Alt */
        buf = MyGame_Example_Alt_parse_json_table(ctx, buf, end, result);
        break;
    default:
        if (!(ctx->flags & flatcc_json_parser_f_skip_unknown)) {
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unknown_union);
        } else {
            return flatcc_json_parser_generic_json(ctx, buf, end);
        }
    }
    if (ctx->error) return buf;
    if (!*result) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
    }
    return buf;
}